

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerators::Run(cmQtAutoGenerators *this,string *targetDirectory,string *config)

{
  byte bVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  auto_ptr<cmMakefile> local_8a0;
  auto_ptr<cmMakefile> mf;
  Directory local_870;
  undefined1 local_848 [8];
  Snapshot snapshot;
  cmGlobalGenerator gg;
  undefined1 local_2d8 [8];
  cmake cm;
  bool success;
  string *config_local;
  string *targetDirectory_local;
  cmQtAutoGenerators *this_local;
  
  cm.CurrentSnapshot.Position.Position._7_1_ = 1;
  cmake::cmake((cmake *)local_2d8);
  cmake::SetHomeOutputDirectory((cmake *)local_2d8,targetDirectory);
  cmake::SetHomeDirectory((cmake *)local_2d8,targetDirectory);
  cmake::GetCurrentSnapshot((Snapshot *)&gg.InstallTargetEnabled,(cmake *)local_2d8);
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&snapshot.Position.Position,(cmake *)local_2d8);
  cmake::GetCurrentSnapshot((Snapshot *)local_848,(cmake *)local_2d8);
  cmState::Snapshot::GetDirectory(&local_870,(Snapshot *)local_848);
  cmState::Directory::SetCurrentBinary(&local_870,targetDirectory);
  cmState::Snapshot::GetDirectory((Directory *)&mf,(Snapshot *)local_848);
  cmState::Directory::SetCurrentSource((Directory *)&mf,targetDirectory);
  pcVar3 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile
            (pcVar3,(cmGlobalGenerator *)&snapshot.Position.Position,(Snapshot *)local_848);
  cmsys::auto_ptr<cmMakefile>::auto_ptr(&local_8a0,pcVar3);
  pcVar3 = cmsys::auto_ptr<cmMakefile>::get(&local_8a0);
  cmGlobalGenerator::SetCurrentMakefile((cmGlobalGenerator *)&snapshot.Position.Position,pcVar3);
  pcVar3 = cmsys::auto_ptr<cmMakefile>::get(&local_8a0);
  ReadAutogenInfoFile(this,pcVar3,targetDirectory,config);
  pcVar3 = cmsys::auto_ptr<cmMakefile>::get(&local_8a0);
  ReadOldMocDefinitionsFile(this,pcVar3,targetDirectory);
  Init(this);
  bVar2 = std::operator==(&this->QtMajorVersion,"4");
  if ((bVar2) || (bVar2 = std::operator==(&this->QtMajorVersion,"5"), bVar2)) {
    pcVar3 = cmsys::auto_ptr<cmMakefile>::get(&local_8a0);
    cm.CurrentSnapshot.Position.Position._7_1_ = RunAutogen(this,pcVar3);
  }
  WriteOldMocDefinitionsFile(this,targetDirectory);
  bVar1 = cm.CurrentSnapshot.Position.Position._7_1_;
  cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_8a0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&snapshot.Position.Position);
  cmake::~cmake((cmake *)local_2d8);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmQtAutoGenerators::Run(const std::string& targetDirectory,
                             const std::string& config)
{
  bool success = true;
  cmake cm;
  cm.SetHomeOutputDirectory(targetDirectory);
  cm.SetHomeDirectory(targetDirectory);
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);

  cmState::Snapshot snapshot = cm.GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(targetDirectory);
  snapshot.GetDirectory().SetCurrentSource(targetDirectory);

  cmsys::auto_ptr<cmMakefile> mf(new cmMakefile(&gg, snapshot));
  gg.SetCurrentMakefile(mf.get());

  this->ReadAutogenInfoFile(mf.get(), targetDirectory, config);
  this->ReadOldMocDefinitionsFile(mf.get(), targetDirectory);

  this->Init();

  if (this->QtMajorVersion == "4" || this->QtMajorVersion == "5")
    {
    success = this->RunAutogen(mf.get());
    }

  this->WriteOldMocDefinitionsFile(targetDirectory);

  return success;
}